

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O0

void __thiscall nuraft::nuraft_global_mgr::~nuraft_global_mgr(nuraft_global_mgr *this)

{
  bool bVar1;
  element_type *peVar2;
  int __how;
  int __how_00;
  int iVar3;
  __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
  *in_RDI;
  ptr<worker_handle> *wh_1;
  shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *entry_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  *__range1_1;
  ptr<worker_handle> *wh;
  shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *entry;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  *__range1;
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  *in_stack_ffffffffffffff98;
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  *in_stack_ffffffffffffffb0;
  shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *local_48;
  __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
  local_40;
  __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
  *local_38;
  reference local_30;
  reference local_28;
  shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *local_20;
  __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
  local_18;
  __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
  *local_10;
  
  local_10 = in_RDI + 0xe;
  local_18._M_current =
       (shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *)
       std::
       vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_20 = (shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *)
             std::
             vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
             ::end(in_stack_ffffffffffffff98);
  while( true ) {
    iVar3 = (int)&local_20;
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
                               *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
               ::operator*(&local_18);
    local_28 = local_30;
    peVar2 = std::
             __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2b79a2);
    worker_handle::shutdown(peVar2,iVar3,__how);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  ::clear((vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
           *)0x2b79c8);
  local_38 = in_RDI + 0xb;
  local_40._M_current =
       (shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *)
       std::
       vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_48 = (shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *)
             std::
             vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
             ::end(in_stack_ffffffffffffff98);
  while( true ) {
    iVar3 = (int)&local_48;
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
                               *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    in_stack_ffffffffffffffb0 =
         (vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
          *)__gnu_cxx::
            __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
            ::operator*(&local_40);
    peVar2 = std::
             __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2b7a2c);
    worker_handle::shutdown(peVar2,iVar3,__how_00);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_*,_std::vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>_>
    ::operator++(&local_40);
  }
  std::
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  ::clear((vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
           *)0x2b7a52);
  std::
  unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                    *)0x2b7a63);
  std::__cxx11::
  list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  ::~list((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
           *)0x2b7a74);
  std::
  unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                    *)0x2b7a85);
  std::__cxx11::
  list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  ::~list((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
           *)0x2b7a96);
  std::
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  ::~vector(in_stack_ffffffffffffffb0);
  std::
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  ::~vector(in_stack_ffffffffffffffb0);
  std::shared_ptr<nuraft::asio_service>::~shared_ptr((shared_ptr<nuraft::asio_service> *)0x2b7ac0);
  return;
}

Assistant:

nuraft_global_mgr::~nuraft_global_mgr() {
    for (auto& entry: append_workers_) {
        ptr<worker_handle>& wh = entry;
        wh->shutdown();
    }
    append_workers_.clear();

    for (auto& entry: commit_workers_) {
        ptr<worker_handle>& wh = entry;
        wh->shutdown();
    }
    commit_workers_.clear();
}